

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-filepath.cc
# Opt level: O2

FilePath __thiscall
testing::internal::FilePath::MakeFileName
          (FilePath *this,FilePath *directory,FilePath *base_name,int number,char *extension)

{
  size_t extraout_RDX;
  FilePath FVar1;
  String file;
  String SStack_38;
  String local_28;
  
  local_28.c_str_ = (char *)0x0;
  local_28.length_ = 0;
  if (number == 0) {
    String::Format((char *)&SStack_38,"%s.%s",(base_name->pathname_).c_str_,extension);
    String::operator=(&local_28,&SStack_38);
  }
  else {
    String::Format((char *)&SStack_38,"%s_%d.%s",(base_name->pathname_).c_str_);
    String::operator=(&local_28,&SStack_38);
  }
  String::~String(&SStack_38);
  FilePath((FilePath *)&SStack_38,&local_28);
  ConcatPaths(this,directory,(FilePath *)&SStack_38);
  String::~String(&SStack_38);
  String::~String(&local_28);
  FVar1.pathname_.length_ = extraout_RDX;
  FVar1.pathname_.c_str_ = (char *)this;
  return (FilePath)FVar1.pathname_;
}

Assistant:

FilePath FilePath::MakeFileName(const FilePath& directory,
                                const FilePath& base_name,
                                int number,
                                const char* extension) {
  String file;
  if (number == 0) {
    file = String::Format("%s.%s", base_name.c_str(), extension);
  } else {
    file = String::Format("%s_%d.%s", base_name.c_str(), number, extension);
  }
  return ConcatPaths(directory, FilePath(file));
}